

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O0

bool __thiscall
text_subtitles::TextSubtitlesRender::rasterText(TextSubtitlesRender *this,string *text)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *str;
  reference ppVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  long lVar11;
  undefined4 extraout_XMM0_Db;
  int local_188;
  int local_178;
  int local_16c;
  int local_160;
  int local_15c;
  RECT rect;
  Font font;
  size_t j_2;
  int curX;
  int xOffs;
  SIZE mSize;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *j_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  vector<int,_std::allocator<int>_> xSize;
  int maxBaseLine;
  int maxHeight;
  int tWidth;
  int ySize;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *j;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  txtParts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int curY;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> fontStack;
  bool forced;
  string *text_local;
  TextSubtitlesRender *this_local;
  
  fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = false;
  memset(this->m_pData,0,(long)this->m_width * (long)this->m_height * 4);
  std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::vector
            ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
             &lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  str = (char *)std::__cxx11::string::c_str();
  splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50,str,'\n');
  __range1._0_4_ = 0;
  Font::operator=(&this->m_initFont,&this->m_font);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar3) break;
    txtParts.
    super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    processTxtLine((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range2,this,
                   (string *)
                   txtParts.
                   super__Vector_base<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
                   &lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end2 = std::
             vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range2);
    j = (pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range2);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&j);
      if (!bVar3) break;
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end2);
      if (((ppVar7->first).m_opts & 0x10U) != 0) {
        fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = true;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
    maxHeight = 0;
    maxBaseLine = 0;
    xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2_1)
    ;
    __end2_1 = std::
               vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range2);
    j_1 = (pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range2);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&j_1);
      if (!bVar3) break;
      mSize = (SIZE)__gnu_cxx::
                    __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&__end2_1);
      (*this->_vptr_TextSubtitlesRender[2])(this,mSize);
      (*this->_vptr_TextSubtitlesRender[4])(this,(long)mSize + 0x38,&curX);
      iVar1 = xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
      if (xOffs < maxHeight) {
        local_16c = maxHeight;
      }
      else {
        local_16c = xOffs;
      }
      maxHeight = local_16c;
      iVar4 = (*this->_vptr_TextSubtitlesRender[5])();
      if (iVar4 < iVar1) {
        local_178 = xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      else {
        local_178 = (*this->_vptr_TextSubtitlesRender[5])();
      }
      iVar1 = (int)xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = local_178;
      iVar4 = (*this->_vptr_TextSubtitlesRender[6])();
      if (iVar4 < iVar1) {
        local_188 = (int)xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_188 = (*this->_vptr_TextSubtitlesRender[6])();
      }
      xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = local_188;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&__range2_1,&curX);
      maxBaseLine = curX + maxBaseLine;
      __gnu_cxx::
      __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2_1);
    }
    iVar1 = this->m_width;
    j_2._0_4_ = 0;
    font.m_color = 0;
    font.m_lineSpacing = 0.0;
    while( true ) {
      sVar8 = std::
              vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range2);
      if (sVar8 <= (ulong)font._48_8_) break;
      pvVar9 = std::
               vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__range2,font._48_8_);
      Font::Font((Font *)&rect.right,&pvVar9->first);
      (*this->_vptr_TextSubtitlesRender[2])(this,&rect.right);
      iVar2 = xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
      local_160 = (int)j_2 + (iVar1 - maxBaseLine) / 2;
      iVar5 = (*this->_vptr_TextSubtitlesRender[5])();
      iVar4 = (int)xSize.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      iVar6 = (*this->_vptr_TextSubtitlesRender[6])();
      local_15c = (int)__range1 + (iVar2 - iVar5) + (iVar6 - iVar4);
      rect.left = this->m_width;
      rect.top = this->m_height;
      pvVar9 = std::
               vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&__range2,font._48_8_);
      (*this->_vptr_TextSubtitlesRender[7])(this,&pvVar9->second,&local_160);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&__range2_1,font._48_8_);
      j_2._0_4_ = *pvVar10 + (int)j_2;
      Font::~Font((Font *)&rect.right);
      font._48_8_ = font._48_8_ + 1;
    }
    lVar11 = std::lround((double)CONCAT44(extraout_XMM0_Db,
                                          (float)maxHeight * (this->m_font).m_lineSpacing));
    __range1._0_4_ = (int)__range1 + (int)lVar11;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&__range2_1);
    std::
    vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  (*this->_vptr_TextSubtitlesRender[8])();
  Font::operator=(&this->m_font,&this->m_initFont);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::~vector
            ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
             &lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return fontStack.super__Vector_base<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
}

Assistant:

bool TextSubtitlesRender::rasterText(const std::string& text)
{
    bool forced = false;
    memset(m_pData, 0, static_cast<size_t>(m_width) * m_height * 4);
    vector<Font> fontStack;
    const vector<string> lines = splitStr(text.c_str(), '\n');
    int curY = 0;
    m_initFont = m_font;
    for (auto& i : lines)
    {
        vector<pair<Font, string>> txtParts = processTxtLine(i, fontStack);
        for (const auto& j : txtParts)
        {
            if (j.first.m_opts & Font::FORCED)
                forced = true;
        }

        int ySize = 0;
        int tWidth = 0;
        int maxHeight = 0;
        int maxBaseLine = 0;
        vector<int> xSize;
        for (auto& j : txtParts)
        {
            setFont(j.first);
            SIZE mSize;
            getTextSize(j.second, &mSize);
            ySize = FFMAX(ySize, mSize.cy);
            maxHeight = FFMAX(maxHeight, getLineSpacing());
            maxBaseLine = FFMAX(maxBaseLine, getBaseline());
            xSize.push_back(mSize.cx);
            tWidth += mSize.cx;
        }
        const int xOffs = (m_width - tWidth) / 2;
        int curX = 0;
        for (size_t j = 0; j < txtParts.size(); j++)
        {
            Font font(txtParts[j].first);
            setFont(font);

            RECT rect = {curX + xOffs, curY + (maxHeight - getLineSpacing()) - (maxBaseLine - getBaseline()), m_width,
                         m_height};
            drawText(txtParts[j].second, &rect);

            curX += xSize[j];
        }
        curY += lround(static_cast<float>(ySize) * m_font.m_lineSpacing);
    }
    flushRasterBuffer();
    m_font = m_initFont;

    return forced;
}